

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q6.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  string str;
  string compressed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  
  get_args_abi_cxx11_(&args,argc,argv);
  if ((long)args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    std::__cxx11::string::string
              ((string *)&str,
               (string *)
               (args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1));
    compress_string(&compressed,&str);
    poVar1 = std::operator<<((ostream *)&std::cout,"compressing ");
    poVar1 = std::operator<<(poVar1,(string *)&str);
    poVar1 = std::operator<<(poVar1," as ");
    poVar1 = std::operator<<(poVar1,(string *)&compressed);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&compressed);
    std::__cxx11::string::~string((string *)&str);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return 0;
}

Assistant:

int main(int argc, char** argv){
  auto args {get_args(argc, argv)};

  if (args.size() == 2){
    std::string str {args[1]};

    auto compressed {compress_string(str)};

    std::cout << "compressing " << str << " as " << compressed << '\n';
  }

  return 0;
}